

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_chmod(uv_pipe_t *handle,int mode)

{
  int iVar1;
  int *piVar2;
  int local_c8;
  size_t sStack_c0;
  int r;
  size_t name_len;
  char *name_buffer;
  stat pipe_stat;
  uint desired_mode;
  int mode_local;
  uv_pipe_t *handle_local;
  
  if ((handle == (uv_pipe_t *)0x0) || ((handle->io_watcher).fd == -1)) {
    handle_local._4_4_ = -9;
  }
  else if (((mode == 1) || (mode == 2)) || (mode == 3)) {
    sStack_c0 = 0;
    pipe_stat.__glibc_reserved[2]._4_4_ = mode;
    handle_local._4_4_ = uv_pipe_getsockname(handle,(char *)0x0,&stack0xffffffffffffff40);
    if (handle_local._4_4_ == -0x69) {
      name_len = (size_t)uv__malloc(sStack_c0);
      if ((char *)name_len == (char *)0x0) {
        handle_local._4_4_ = -0xc;
      }
      else {
        handle_local._4_4_ = uv_pipe_getsockname(handle,(char *)name_len,&stack0xffffffffffffff40);
        if (handle_local._4_4_ == 0) {
          iVar1 = stat((char *)name_len,(stat *)&name_buffer);
          if (iVar1 == -1) {
            uv__free((void *)name_len);
            piVar2 = __errno_location();
            handle_local._4_4_ = -*piVar2;
          }
          else {
            pipe_stat.__glibc_reserved[2]._0_4_ = 0;
            if ((pipe_stat.__glibc_reserved[2]._4_4_ & 1) != 0) {
              pipe_stat.__glibc_reserved[2]._0_4_ = 0x124;
            }
            if ((pipe_stat.__glibc_reserved[2]._4_4_ & 2) != 0) {
              pipe_stat.__glibc_reserved[2]._0_4_ = (uint)pipe_stat.__glibc_reserved[2] | 0x92;
            }
            if (((uint)pipe_stat.st_nlink & (uint)pipe_stat.__glibc_reserved[2]) ==
                (uint)pipe_stat.__glibc_reserved[2]) {
              uv__free((void *)name_len);
              handle_local._4_4_ = 0;
            }
            else {
              pipe_stat.st_nlink._0_4_ =
                   (uint)pipe_stat.__glibc_reserved[2] | (uint)pipe_stat.st_nlink;
              iVar1 = chmod((char *)name_len,(uint)pipe_stat.st_nlink);
              uv__free((void *)name_len);
              if (iVar1 == -1) {
                piVar2 = __errno_location();
                local_c8 = -*piVar2;
              }
              else {
                local_c8 = 0;
              }
              handle_local._4_4_ = local_c8;
            }
          }
        }
        else {
          uv__free((void *)name_len);
        }
      }
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_chmod(uv_pipe_t* handle, int mode) {
  unsigned desired_mode;
  struct stat pipe_stat;
  char* name_buffer;
  size_t name_len;
  int r;

  if (handle == NULL || uv__stream_fd(handle) == -1)
    return UV_EBADF;

  if (mode != UV_READABLE &&
      mode != UV_WRITABLE &&
      mode != (UV_WRITABLE | UV_READABLE))
    return UV_EINVAL;

  /* Unfortunately fchmod does not work on all platforms, we will use chmod. */
  name_len = 0;
  r = uv_pipe_getsockname(handle, NULL, &name_len);
  if (r != UV_ENOBUFS)
    return r;

  name_buffer = uv__malloc(name_len);
  if (name_buffer == NULL)
    return UV_ENOMEM;

  r = uv_pipe_getsockname(handle, name_buffer, &name_len);
  if (r != 0) {
    uv__free(name_buffer);
    return r;
  }

  /* stat must be used as fstat has a bug on Darwin */
  if (stat(name_buffer, &pipe_stat) == -1) {
    uv__free(name_buffer);
    return -errno;
  }

  desired_mode = 0;
  if (mode & UV_READABLE)
    desired_mode |= S_IRUSR | S_IRGRP | S_IROTH;
  if (mode & UV_WRITABLE)
    desired_mode |= S_IWUSR | S_IWGRP | S_IWOTH;

  /* Exit early if pipe already has desired mode. */
  if ((pipe_stat.st_mode & desired_mode) == desired_mode) {
    uv__free(name_buffer);
    return 0;
  }

  pipe_stat.st_mode |= desired_mode;

  r = chmod(name_buffer, pipe_stat.st_mode);
  uv__free(name_buffer);

  return r != -1 ? 0 : UV__ERR(errno);
}